

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O3

big_integer *
anon_unknown.dwarf_cd9f::extract_random_element<big_integer>
          (big_integer *__return_storage_ptr__,vector<big_integer,_std::allocator<big_integer>_> *v)

{
  int8_t iVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer puVar4;
  void *pvVar5;
  pointer puVar6;
  big_integer *pbVar7;
  pointer puVar8;
  pointer puVar9;
  int iVar10;
  big_integer *extraout_RAX;
  ulong uVar11;
  
  iVar10 = rand();
  pbVar2 = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = (ulong)(long)iVar10 %
           (ulong)((long)(v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)pbVar2 >> 5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&__return_storage_ptr__->digits,&pbVar2[uVar11].digits);
  __return_storage_ptr__->sign = pbVar2[uVar11].sign;
  pbVar2 = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pbVar3 = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar4 = pbVar3[-1].digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
  puVar8 = pbVar3[-1].digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar9 = pbVar3[-1].digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pbVar3[-1].digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pbVar3[-1].digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar3[-1].digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = pbVar3[-1].sign;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&pbVar3[-1].digits,pbVar2 + uVar11);
  pbVar3[-1].sign = pbVar2[uVar11].sign;
  pvVar5 = *(void **)&pbVar2[uVar11].digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
  puVar6 = *(pointer *)
            ((long)&pbVar2[uVar11].digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 0x10);
  *(pointer *)
   &pbVar2[uVar11].digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl =
       puVar8;
  *(pointer *)
   ((long)&pbVar2[uVar11].digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl + 8) = puVar9;
  *(pointer *)
   ((long)&pbVar2[uVar11].digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl + 0x10) = puVar4;
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,(long)puVar6 - (long)pvVar5);
  }
  pbVar2[uVar11].sign = iVar1;
  pbVar7 = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.super__Vector_impl_data
  ._M_finish = pbVar7 + -1;
  puVar4 = pbVar7[-1].digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)pbVar7[-1].digits.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
    return extraout_RAX;
  }
  return pbVar7;
}

Assistant:

T extract_random_element(std::vector<T> &v) {
        size_t index = rand() % v.size();
        T copy = v[index];
        erase_unordered(v, v.begin() + index);
        return copy;
    }